

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_deduc.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string _listinit_type;
  string _dbl_type;
  string _str_type;
  string _int_type;
  char *local_a8;
  char *local_a0;
  char local_98;
  undefined7 uStack_97;
  char *local_88;
  char *local_80;
  char local_78;
  undefined7 uStack_77;
  char *local_68;
  char *local_60;
  char local_58;
  undefined7 uStack_57;
  char *local_48;
  long local_40;
  char local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = '\0';
  local_60 = (char *)0x0;
  local_58 = '\0';
  local_80 = (char *)0x0;
  local_78 = '\0';
  local_a0 = (char *)0x0;
  local_98 = '\0';
  if (_put[*_put == '*'] == 'i') {
    pcVar3 = "unknown/non-gcc/clang compiler";
    if (_put[(ulong)(*_put == '*') + 1] == '\0') {
      pcVar3 = "int";
    }
  }
  else {
    pcVar3 = "unknown/non-gcc/clang compiler";
  }
  local_a8 = &local_98;
  local_88 = &local_78;
  local_68 = &local_58;
  local_48 = &local_38;
  std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,(ulong)pcVar3);
  if ((__Init[*__Init == '*'] == 'd') && (__Init[(ulong)(*__Init == '*') + 1] == '\0')) {
    pcVar3 = "double";
  }
  else {
    pcVar3 = "unknown/non-gcc/clang compiler";
  }
  std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,(ulong)pcVar3);
  iVar1 = strcmp(_flush + (*_flush == '*'),"PKc");
  pcVar3 = "unknown/non-gcc/clang compiler";
  if (iVar1 == 0) {
    pcVar3 = "std::string";
  }
  std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,(ulong)pcVar3);
  std::__cxx11::string::_M_replace((ulong)&local_a8,0,local_a0,0x10203e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"_int\": ",8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is an ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"_dbl\": ",8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is an ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_88,(long)local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"_str\": ",8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is an ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_68,(long)local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"_listinit\": ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\"List\", \"Init\"}",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is an ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_a8,(long)local_a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return 0;
}

Assistant:

int main() {
	auto _int {9};
	auto _str {"Marc-Elie"};
	auto _dbl {23.5};
	//It's a shame std::initializer_list<> is not subscriptable :/
	auto _listinit = { "List", "Init"};
	std::string _int_type,_str_type,_dbl_type,_listinit_type;

	/* This solution is not portable across compilers--
		The result of std::type_info.name() is mangled
		on gcc and clang but IBM, Oracle, and MSVC
		provide human readable names. */

	if ( std::strcmp((typeid(_int).name()), "i") == 0 ) { _int_type = "int"; }
	else { _int_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_dbl).name()), "d") == 0 ) { _dbl_type = "double"; }
	else { _dbl_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_str).name()), "PKc") == 0 ) { _str_type = "std::string"; }
	else { _str_type = "unknown/non-gcc/clang compiler"; }

	if ( std::strcmp((typeid(_listinit).name()), "St16initializer_listIPKcE") == 0 ) 
		 { _listinit_type = "std::initializer_list<char const*>"; }
	else { _listinit_type = "unknown/non-gcc/clang compiler"; }

	//Print the values and their types
	std::cout << "\n"
		<<"\"_int\": " << _int << " is an " << _int_type << ".\n"
		<<"\"_dbl\": " << _int << " is an " << _dbl_type << ".\n"
		<<"\"_str\": " << _int << " is an " << _str_type << ".\n"
		<<"\"_listinit\": " << "{\"List\", \"Init\"}"<< " is an " << _listinit_type << ".\n"
		<<std::endl;
}